

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

_Bool Curl_conncache_return_conn(connectdata *conn)

{
  Curl_easy *data;
  Curl_share *pCVar1;
  size_t sVar2;
  connectdata *conn_00;
  connectdata *pcVar3;
  ulong uVar4;
  
  data = conn->data;
  uVar4 = data->multi->maxconnects;
  if ((long)uVar4 < 0) {
    uVar4 = (long)data->multi->num_easy << 2;
  }
  if (uVar4 != 0) {
    sVar2 = Curl_conncache_size(data);
    if (uVar4 < sVar2) {
      Curl_infof(data,"Connection cache is full, closing the oldest one.\n");
      conn_00 = Curl_conncache_extract_oldest(data);
      pcVar3 = (connectdata *)0x0;
      if (conn_00 != (connectdata *)0x0) {
        conn_00->data = data;
        Curl_disconnect(conn_00,false);
        pcVar3 = conn_00;
      }
      goto LAB_0013997b;
    }
  }
  pcVar3 = (connectdata *)0x0;
LAB_0013997b:
  if (data->share == (Curl_share *)0x0) {
    conn->inuse = false;
  }
  else {
    Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    pCVar1 = data->share;
    conn->inuse = false;
    if (pCVar1 != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
  }
  return pcVar3 != conn;
}

Assistant:

bool Curl_conncache_return_conn(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;

  /* data->multi->maxconnects can be negative, deal with it. */
  size_t maxconnects =
    (data->multi->maxconnects < 0) ? data->multi->num_easy * 4:
    data->multi->maxconnects;
  struct connectdata *conn_candidate = NULL;

  if(maxconnects > 0 &&
     Curl_conncache_size(data) > maxconnects) {
    infof(data, "Connection cache is full, closing the oldest one.\n");

    conn_candidate = Curl_conncache_extract_oldest(data);

    if(conn_candidate) {
      /* Set the connection's owner correctly */
      conn_candidate->data = data;

      /* the winner gets the honour of being disconnected */
      (void)Curl_disconnect(conn_candidate, /* dead_connection */ FALSE);
    }
  }
  CONN_LOCK(data);
  conn->inuse = FALSE; /* Mark the connection unused */
  CONN_UNLOCK(data);

  return (conn_candidate == conn) ? FALSE : TRUE;

}